

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyDecodingSynapse.cpp
# Opt level: O0

void __thiscall
LatencyDecodingSynapse::LatencyDecodingSynapse
          (LatencyDecodingSynapse *this,Population *n_from,Population *n_to,
          LatencyDecodingSynapse_param *param)

{
  _func_int **in_RCX;
  Synapse *in_RDI;
  Population *unaff_retaddr;
  Population *in_stack_00000008;
  LatencyDecodingSynapse *in_stack_00000010;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffffd0;
  
  Synapse::Synapse(in_RDI);
  in_RDI->_vptr_Synapse = (_func_int **)&PTR_update_0018fd50;
  in_RDI[1]._vptr_Synapse = in_RCX;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(in_stack_ffffffffffffffd0);
  std::vector<Event_*,_std::allocator<Event_*>_>::vector
            ((vector<Event_*,_std::allocator<Event_*>_> *)0x170791);
  initialize(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

LatencyDecodingSynapse::LatencyDecodingSynapse(Population* n_from, Population* n_to, LatencyDecodingSynapse_param* param) : 
    param(param)
{
    initialize(n_from, n_to);
}